

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes WaitId(CSzData *sd,UInt32 id)

{
  SRes SVar1;
  SRes SVar2;
  ulong in_RAX;
  SRes unaff_EBP;
  bool bVar3;
  UInt64 type;
  ulong local_28;
  
  local_28 = in_RAX;
  do {
    SVar1 = ReadNumber(sd,&local_28);
    bVar3 = false;
    if (SVar1 == 0) {
      if (local_28 == id) {
        SVar1 = 0;
      }
      else if (local_28 == 0) {
        bVar3 = false;
        SVar1 = 0x10;
      }
      else {
        SVar2 = SkipData(sd);
        bVar3 = SVar2 == 0;
        SVar1 = unaff_EBP;
        if (!bVar3) {
          SVar1 = SVar2;
        }
      }
    }
    unaff_EBP = SVar1;
  } while (bVar3);
  return unaff_EBP;
}

Assistant:

static SRes WaitId(CSzData *sd, UInt32 id)
{
  for (;;)
  {
    UInt64 type;
    RINOK(ReadID(sd, &type));
    if (type == id)
      return SZ_OK;
    if (type == k7zIdEnd)
      return SZ_ERROR_ARCHIVE;
    RINOK(SkipData(sd));
  }
}